

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_sys_cfg_st_test.c
# Opt level: O3

int main(void)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  MppSysCfgStVStrd v_stride_cfg;
  MppSysCfgStHStrd h_stride_cfg;
  undefined8 local_a8;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined8 local_7c;
  undefined4 local_74;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test h_stride start\n",0);
  local_7c = 0x10000001000004;
  local_74 = 0x1000;
  iVar1 = mpp_sys_cfg_st_get_h_stride(&local_7c);
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test result: h_stride_by_pixel(%d)",0,local_6c);
  pcVar2 = "failed";
  pcVar3 = "failed";
  if (iVar1 == 0) {
    pcVar3 = "success";
  }
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test h_stride done %s\n",0,pcVar3);
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test byte_stride start\n",0);
  local_98 = 0x1000004;
  uStack_94 = 0;
  uStack_90 = 0x100000;
  uStack_8c = 0x1000;
  iVar1 = mpp_sys_cfg_st_get_byte_stride(&local_98);
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test result: h_stride_by_byte(%d)",0,local_88);
  pcVar3 = "failed";
  if (iVar1 == 0) {
    pcVar3 = "success";
  }
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test byte_stride done %s\n",0,pcVar3);
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test v_stride_cfg start\n",0);
  local_a8 = 0x10000001000004;
  local_a0 = 0x900;
  iVar1 = mpp_sys_cfg_st_get_v_stride(&local_a8);
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test result: v_stride(%d)",0,local_9c);
  pcVar3 = "failed";
  if (iVar1 == 0) {
    pcVar3 = "success";
  }
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test v_stride_cfg done %s\n",0,pcVar3);
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test size_cfg start\n",0);
  local_68 = 0x1000004;
  uStack_64 = 0;
  uStack_60 = 0x100000;
  uStack_5c = 0x1000;
  local_58 = 0x900;
  iVar1 = mpp_sys_cfg_st_get_size(&local_68);
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test result: h_stride_by_pixel(%d)",0,local_4c);
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test result: h_stride_by_byte(%d)",0,local_54);
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test result: v_stride(%d)",0,local_50);
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test result: size_total(%d)",0,local_48);
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test result: size_fbc_hdr(%d)",0,local_44);
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test result: size_fbc_bdy(%d)",0,local_40);
  if (iVar1 == 0) {
    pcVar2 = "success";
  }
  _mpp_log_l(4,0,"mpp_sys_cfg_st_test size_cfg done %s\n",0,pcVar2);
  return iVar1;
}

Assistant:

int main()
{
    MPP_RET ret = MPP_OK;
    MppCodingType type = MPP_VIDEO_CodingHEVC;
    RK_U32 width = 4096;
    RK_U32 height = 2304;

    MppSysCfgStHStrd h_stride_cfg;
    MppSysCfgStHByteStrd byte_stride_cfg;
    MppSysCfgStVStrd v_stride_cfg;
    MppSysCfgStSize size_cfg;


    mpp_log("mpp_sys_cfg_st_test h_stride start\n");
    h_stride_cfg.type = type;
    h_stride_cfg.fmt_fbc = MPP_FRAME_FBC_AFBC_V1;
    h_stride_cfg.width = width;
    ret = mpp_sys_cfg_st_get_h_stride(&h_stride_cfg);
    mpp_log("mpp_sys_cfg_st_test result: h_stride_by_pixel(%d)",
            h_stride_cfg.h_stride_by_pixel);
    mpp_log("mpp_sys_cfg_st_test h_stride done %s\n", ret ? "failed" : "success");


    mpp_log("mpp_sys_cfg_st_test byte_stride start\n");
    byte_stride_cfg.type = type;
    byte_stride_cfg.fmt_codec = MPP_FMT_YUV420SP;
    byte_stride_cfg.fmt_fbc = MPP_FRAME_FBC_AFBC_V1;
    byte_stride_cfg.width = width;
    ret = mpp_sys_cfg_st_get_byte_stride(&byte_stride_cfg);
    mpp_log("mpp_sys_cfg_st_test result: h_stride_by_byte(%d)",
            byte_stride_cfg.h_stride_by_byte);
    mpp_log("mpp_sys_cfg_st_test byte_stride done %s\n", ret ? "failed" : "success");


    mpp_log("mpp_sys_cfg_st_test v_stride_cfg start\n");
    v_stride_cfg.type = type;
    v_stride_cfg.fmt_fbc = MPP_FRAME_FBC_AFBC_V1;
    v_stride_cfg.height = height;
    ret = mpp_sys_cfg_st_get_v_stride(&v_stride_cfg);
    mpp_log("mpp_sys_cfg_st_test result: v_stride(%d)",
            v_stride_cfg.v_stride);
    mpp_log("mpp_sys_cfg_st_test v_stride_cfg done %s\n", ret ? "failed" : "success");


    mpp_log("mpp_sys_cfg_st_test size_cfg start\n");
    size_cfg.type = type;
    size_cfg.fmt_codec = MPP_FMT_YUV420SP;
    size_cfg.fmt_fbc = MPP_FRAME_FBC_AFBC_V1;
    size_cfg.width = width;
    size_cfg.height = height;
    ret = mpp_sys_cfg_st_get_size(&size_cfg);
    mpp_log("mpp_sys_cfg_st_test result: h_stride_by_pixel(%d)",
            size_cfg.h_stride_by_pixel);
    mpp_log("mpp_sys_cfg_st_test result: h_stride_by_byte(%d)",
            size_cfg.h_stride_by_byte);
    mpp_log("mpp_sys_cfg_st_test result: v_stride(%d)",
            size_cfg.v_stride);
    mpp_log("mpp_sys_cfg_st_test result: size_total(%d)",
            size_cfg.size_total);
    mpp_log("mpp_sys_cfg_st_test result: size_fbc_hdr(%d)",
            size_cfg.size_fbc_hdr);
    mpp_log("mpp_sys_cfg_st_test result: size_fbc_bdy(%d)",
            size_cfg.size_fbc_bdy);
    mpp_log("mpp_sys_cfg_st_test size_cfg done %s\n", ret ? "failed" : "success");


    return ret;
}